

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void sbs_compare(sbs_t *sbs)

{
  uint size1;
  int iVar1;
  uint32_t *a2;
  uint64_t uVar2;
  uint32_t *a1;
  long in_RDI;
  uint32_t i_2;
  _Bool ok;
  uint32_t *actual_values;
  uint32_t actual_cardinality;
  uint32_t j;
  uint32_t dst;
  uint32_t i_1;
  uint32_t *expected_values;
  uint64_t word;
  uint32_t i;
  uint32_t expected_cardinality;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint local_28;
  uint local_24;
  ulong local_18;
  uint local_10;
  uint local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0x10); local_10 = local_10 + 1) {
    for (local_18 = *(ulong *)(*(long *)(in_RDI + 8) + (ulong)local_10 * 8); local_18 != 0;
        local_18 = local_18 & local_18 - 1) {
      local_c = local_c + 1;
    }
  }
  a2 = (uint32_t *)malloc((ulong)local_c << 2);
  memset(a2,0,(ulong)local_c << 2);
  local_28 = 0;
  for (local_24 = 0; local_24 < *(uint *)(in_RDI + 0x10); local_24 = local_24 + 1) {
    for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < 0x40;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
      if ((*(ulong *)(*(long *)(in_RDI + 8) + (ulong)local_24 * 8) &
          1L << ((byte)in_stack_ffffffffffffffd4 & 0x3f)) != 0) {
        a2[local_28] = local_24 * 0x40 + in_stack_ffffffffffffffd4;
        local_28 = local_28 + 1;
      }
    }
  }
  uVar2 = roaring_bitmap_get_cardinality
                    ((roaring_bitmap_t *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  size1 = (uint)uVar2;
  a1 = (uint32_t *)malloc((uVar2 & 0xffffffff) << 2);
  memset(a1,0,(ulong)size1 << 2);
  roaring_bitmap_to_uint32_array
            ((roaring_bitmap_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  iVar1 = array_equals(a1,size1,a2,local_c);
  uVar3 = CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffffc4);
  if (iVar1 == 0) {
    printf("Expected: ");
    for (in_stack_ffffffffffffffc0 = 0; in_stack_ffffffffffffffc0 < local_c;
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
      printf("%u ",(ulong)a2[in_stack_ffffffffffffffc0]);
    }
    printf("\n");
    printf("Actual: ");
    roaring_bitmap_printf((roaring_bitmap_t *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
    printf("\n");
  }
  free(a1);
  free(a2);
  _assert_true(CONCAT44(in_stack_ffffffffffffffd4,size1),(char *)a1,
               (char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void sbs_compare(sbs_t *sbs) {
    uint32_t expected_cardinality = 0;
    for (uint32_t i = 0; i < sbs->size; i++) {
        uint64_t word = sbs->words[i];
        while (word != 0) {
            expected_cardinality += 1;
            word = word & (word - 1);
        }
    }
    uint32_t *expected_values =
        (uint32_t *)malloc(expected_cardinality * sizeof(uint32_t));
    memset(expected_values, 0, expected_cardinality * sizeof(uint32_t));
    for (uint32_t i = 0, dst = 0; i < sbs->size; i++) {
        for (uint32_t j = 0; j < 64; j++) {
            if ((sbs->words[i] & (UINT64_C(1) << j)) != 0) {
                expected_values[dst++] = i * 64 + j;
            }
        }
    }

    uint32_t actual_cardinality = roaring_bitmap_get_cardinality(sbs->roaring);
    uint32_t *actual_values =
        (uint32_t *)malloc(actual_cardinality * sizeof(uint32_t));
    memset(actual_values, 0, actual_cardinality * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(sbs->roaring, actual_values);

    bool ok = array_equals(actual_values, actual_cardinality, expected_values,
                           expected_cardinality);
    if (!ok) {
        printf("Expected: ");
        for (uint32_t i = 0; i < expected_cardinality; i++) {
            printf("%u ", expected_values[i]);
        }
        printf("\n");

        printf("Actual: ");
        roaring_bitmap_printf(sbs->roaring);
        printf("\n");
    }
    free(actual_values);
    free(expected_values);
    assert_true(ok);
}